

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

double FrictionToMoveFactor(double friction)

{
  undefined8 local_18;
  double movefactor;
  double friction_local;
  
  if (friction < 0.90625) {
    local_18 = ((friction * 65536.0 - 56116.0) * 10.0) / 128.0;
  }
  else {
    local_18 = ((65682.0 - friction * 65536.0) * 1024.0) / 4352.0 + 568.0;
  }
  local_18 = local_18 / 65536.0;
  if (local_18 < 0.00048828125) {
    local_18 = 0.00048828125;
  }
  return local_18;
}

Assistant:

double FrictionToMoveFactor(double friction)
{
	double movefactor;

	// [RH] Twiddled these values so that velocity on ice (with
	//		friction 0xf900) is the same as in Heretic/Hexen.
	if (friction >= ORIG_FRICTION)	// ice
									//movefactor = ((0x10092 - friction)*(0x70))/0x158;
		movefactor = (((0x10092 - friction * 65536) * 1024) / 4352 + 568) / 65536.;
	else
		movefactor = (((friction*65536. - 0xDB34)*(0xA)) / 0x80) / 65536.;

	// killough 8/28/98: prevent odd situations
	if (movefactor < 1 / 2048.)
		movefactor = 1 / 2048.;

	return movefactor;
}